

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValue.cpp
# Opt level: O0

XMLCh * xercesc_4_0::XSValue::getCanRepStrings
                  (XMLCh *content,DataType datatype,Status *status,XMLVersion version,
                  bool toValidate,MemoryManager *manager)

{
  bool bVar1;
  XMLCh *canRep_1;
  XMLCh *canRep;
  ArrayJanitor<char16_t> janTmpName_1;
  XMLCh *tmpStrValue_1;
  undefined1 local_50 [8];
  ArrayJanitor<char16_t> janTmpName;
  XMLCh *tmpStrValue;
  MemoryManager *manager_local;
  bool toValidate_local;
  XMLVersion version_local;
  Status *status_local;
  DataType datatype_local;
  XMLCh *content_local;
  
  switch(datatype) {
  case dt_string:
  case dt_anyURI:
  case dt_QName:
  case dt_NOTATION:
  case dt_normalizedString:
  case dt_token:
  case dt_language:
  case dt_NMTOKEN:
  case dt_NMTOKENS:
  case dt_Name:
  case dt_NCName:
  case dt_ID:
  case dt_IDREF:
  case dt_IDREFS:
  case dt_ENTITY:
  case dt_ENTITIES:
    if ((!toValidate) || (bVar1 = validateStrings(content,datatype,status,version,manager), bVar1))
    {
      *status = st_NoCanRep;
    }
    else {
      *status = st_FOCA0002;
    }
    content_local = (XMLCh *)0x0;
    break;
  case dt_boolean:
    janTmpName.fMemoryManager = (MemoryManager *)XMLString::replicate(content,manager);
    ArrayJanitor<char16_t>::ArrayJanitor
              ((ArrayJanitor<char16_t> *)local_50,(char16_t *)janTmpName.fMemoryManager,manager);
    XMLString::trim((XMLCh *)janTmpName.fMemoryManager);
    bVar1 = XMLString::equals((XMLCh *)janTmpName.fMemoryManager,
                              (XMLCh *)XMLUni::fgBooleanValueSpace);
    if ((bVar1) ||
       (bVar1 = XMLString::equals((XMLCh *)janTmpName.fMemoryManager,
                                  (XMLCh *)(XMLUni::fgBooleanValueSpace + 0x20)), bVar1)) {
      content_local = XMLString::replicate((XMLCh *)XMLUni::fgBooleanValueSpace,manager);
    }
    else {
      bVar1 = XMLString::equals((XMLCh *)janTmpName.fMemoryManager,
                                (XMLCh *)(XMLUni::fgBooleanValueSpace + 0x10));
      if ((bVar1) ||
         (bVar1 = XMLString::equals((XMLCh *)janTmpName.fMemoryManager,
                                    (XMLCh *)(XMLUni::fgBooleanValueSpace + 0x30)), bVar1)) {
        content_local = XMLString::replicate((XMLCh *)(XMLUni::fgBooleanValueSpace + 0x10),manager);
      }
      else {
        *status = st_FOCA0002;
        content_local = (XMLCh *)0x0;
      }
    }
    ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)local_50);
    break;
  default:
    content_local = (XMLCh *)0x0;
    break;
  case dt_hexBinary:
    janTmpName_1.fMemoryManager = (MemoryManager *)XMLString::replicate(content,manager);
    ArrayJanitor<char16_t>::ArrayJanitor
              ((ArrayJanitor<char16_t> *)&canRep,(char16_t *)janTmpName_1.fMemoryManager,manager);
    XMLString::trim((XMLCh *)janTmpName_1.fMemoryManager);
    content_local = HexBin::getCanonicalRepresentation((XMLCh *)janTmpName_1.fMemoryManager,manager)
    ;
    if (content_local == (XMLCh *)0x0) {
      *status = st_FOCA0002;
    }
    ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&canRep);
    break;
  case dt_base64Binary:
    content_local = Base64::getCanonicalRepresentation(content,manager,Conf_RFC2045);
    if (content_local == (XMLCh *)0x0) {
      *status = st_FOCA0002;
    }
  }
  return content_local;
}

Assistant:

XMLCh* XSValue::getCanRepStrings(const XMLCh*         const content
                               ,       DataType             datatype
                               ,       Status&              status
                               ,       XMLVersion           version
                               ,       bool                 toValidate
                               ,       MemoryManager* const manager)
{
    switch (datatype) {
        case XSValue::dt_boolean:
            {
            XMLCh* tmpStrValue = XMLString::replicate(content, manager);
            ArrayJanitor<XMLCh> janTmpName(tmpStrValue, manager);
            XMLString::trim(tmpStrValue);
            //always validate before getting canRep
            if (XMLString::equals(tmpStrValue, XMLUni::fgBooleanValueSpace[0]) ||
                XMLString::equals(tmpStrValue, XMLUni::fgBooleanValueSpace[2])  )
            {
                return XMLString::replicate(XMLUni::fgBooleanValueSpace[0], manager);
            }
            else if (XMLString::equals(tmpStrValue, XMLUni::fgBooleanValueSpace[1]) ||
                     XMLString::equals(tmpStrValue, XMLUni::fgBooleanValueSpace[3])  )
            {
                return XMLString::replicate(XMLUni::fgBooleanValueSpace[1], manager);
            }
            else
            {
                status = st_FOCA0002;
                return 0;
            }
            }
            break;
        case XSValue::dt_hexBinary:
            {
                //HexBin::getCanonicalRepresentation does validation automatically
                XMLCh* tmpStrValue = XMLString::replicate(content, manager);
                ArrayJanitor<XMLCh> janTmpName(tmpStrValue, manager);
                XMLString::trim(tmpStrValue);

                XMLCh* canRep = HexBin::getCanonicalRepresentation(tmpStrValue, manager);
                if (!canRep)
                    status = st_FOCA0002;

                return canRep;
                break;
            }
        case XSValue::dt_base64Binary:
            {
                //Base64::getCanonicalRepresentation does validation automatically
                XMLCh* canRep = Base64::getCanonicalRepresentation(content, manager);
                if (!canRep)
                    status = st_FOCA0002;

                return canRep;
                break;
            }
        case XSValue::dt_anyURI:
        case XSValue::dt_QName:
        case XSValue::dt_NOTATION:
        case XSValue::dt_string:
        case XSValue::dt_normalizedString:
        case XSValue::dt_token:
        case XSValue::dt_language:
        case XSValue::dt_NMTOKEN:
        case XSValue::dt_NMTOKENS:
        case XSValue::dt_Name:
        case XSValue::dt_NCName:
        case XSValue::dt_ID:
        case XSValue::dt_IDREF:
        case XSValue::dt_ENTITY:
        case XSValue::dt_ENTITIES:
        case XSValue::dt_IDREFS:
            if (toValidate && !validateStrings(content, datatype, status, version, manager))
                status = st_FOCA0002;
            else
                status = st_NoCanRep;

            return 0;
            break;
        default:
            return 0;
            break;
    }

    return 0;
}